

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::find<kj::StringPtr,char_const(&)[4]>
          (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this,
          ArrayPtr<kj::StringPtr> table,char (*params) [7])

{
  StringPtr a;
  bool bVar1;
  size_t index;
  StringPtr *pSVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *this_00;
  char (*in_R8) [7];
  Maybe<unsigned_long> MVar4;
  size_t local_90;
  ArrayPtr<const_char> local_88;
  char *local_78;
  size_t local_70;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:1530:22)>
  local_68;
  undefined1 local_48 [8];
  Iterator iter;
  char (*params_local) [7];
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this_local;
  ArrayPtr<kj::StringPtr> table_local;
  
  this_local = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)table.size_;
  this_00 = (TreeIndex<kj::_::(anonymous_namespace)::StringCompare> *)table.ptr;
  iter._16_8_ = in_R8;
  table_local.ptr = (StringPtr *)params;
  table_local.size_ = (size_t)this;
  searchKey<kj::StringPtr,char_const[4]>
            (&local_68,this_00,(ArrayPtr<kj::StringPtr> *)&this_local,in_R8);
  kj::_::BTreeImpl::search
            ((Iterator *)local_48,(BTreeImpl *)(this_00 + 8),&local_68.super_SearchKey);
  bVar1 = kj::_::BTreeImpl::Iterator::isEnd((Iterator *)local_48);
  if (!bVar1) {
    index = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_48);
    pSVar2 = ArrayPtr<kj::StringPtr>::operator[]((ArrayPtr<kj::StringPtr> *)&this_local,index);
    local_78 = (pSVar2->content).ptr;
    local_70 = (pSVar2->content).size_;
    StringPtr::StringPtr((StringPtr *)&local_88,(char *)iter._16_8_);
    a.content.size_ = local_70;
    a.content.ptr = local_78;
    bVar1 = kj::_::anon_unknown_0::StringCompare::matches
                      ((StringCompare *)this_00,a,(StringPtr)local_88);
    if (bVar1) {
      local_90 = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_48);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_90);
      aVar3 = extraout_RDX;
      goto LAB_00211a7f;
    }
  }
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
  aVar3 = extraout_RDX_00;
LAB_00211a7f:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    auto iter = impl.search(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return size_t(*iter);
    } else {
      return kj::none;
    }
  }